

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cffdrivr.c
# Opt level: O3

FT_Error cff_get_ros(CFF_Face face,char **registry,char **ordering,FT_Int *supplement)

{
  uint uVar1;
  void *pvVar2;
  char *pcVar3;
  
  pvVar2 = (face->extra).data;
  if (pvVar2 == (void *)0x0) {
    return 0;
  }
  uVar1 = *(uint *)((long)pvVar2 + 0x74c);
  if (uVar1 == 0xffff) {
    return 6;
  }
  if (registry != (char **)0x0) {
    pcVar3 = *(char **)((long)pvVar2 + 0x1378);
    if (pcVar3 == (char *)0x0) {
      if (uVar1 < 0x187) {
        if (*(long *)((long)pvVar2 + 0x1360) == 0) goto LAB_001fb5d3;
        pcVar3 = (char *)(**(code **)(*(long *)((long)pvVar2 + 0x1360) + 0x28))();
      }
      else if (uVar1 - 0x187 < *(uint *)((long)pvVar2 + 0x648)) {
        pcVar3 = *(char **)(*(long *)((long)pvVar2 + 0x650) + (ulong)(uVar1 - 0x187) * 8);
      }
      else {
LAB_001fb5d3:
        pcVar3 = (char *)0x0;
      }
      *(char **)((long)pvVar2 + 0x1378) = pcVar3;
    }
    *registry = pcVar3;
  }
  if (ordering == (char **)0x0) goto LAB_001fb60f;
  pcVar3 = *(char **)((long)pvVar2 + 0x1380);
  if (pcVar3 == (char *)0x0) {
    uVar1 = *(uint *)((long)pvVar2 + 0x750);
    if (uVar1 == 0xffff) {
LAB_001fb602:
      pcVar3 = (char *)0x0;
    }
    else if (uVar1 < 0x187) {
      if (*(long *)((long)pvVar2 + 0x1360) == 0) goto LAB_001fb602;
      pcVar3 = (char *)(**(code **)(*(long *)((long)pvVar2 + 0x1360) + 0x28))();
    }
    else {
      if (*(uint *)((long)pvVar2 + 0x648) <= uVar1 - 0x187) goto LAB_001fb602;
      pcVar3 = *(char **)(*(long *)((long)pvVar2 + 0x650) + (ulong)(uVar1 - 0x187) * 8);
    }
    *(char **)((long)pvVar2 + 0x1380) = pcVar3;
  }
  *ordering = pcVar3;
LAB_001fb60f:
  if (supplement != (FT_Int *)0x0) {
    *supplement = *(FT_Int *)((long)pvVar2 + 0x758);
  }
  return 0;
}

Assistant:

static FT_Error
  cff_get_ros( CFF_Face      face,
               const char*  *registry,
               const char*  *ordering,
               FT_Int       *supplement )
  {
    FT_Error  error = FT_Err_Ok;
    CFF_Font  cff   = (CFF_Font)face->extra.data;


    if ( cff )
    {
      CFF_FontRecDict  dict = &cff->top_font.font_dict;


      if ( dict->cid_registry == 0xFFFFU )
      {
        error = FT_THROW( Invalid_Argument );
        goto Fail;
      }

      if ( registry )
      {
        if ( !cff->registry )
          cff->registry = cff_index_get_sid_string( cff,
                                                    dict->cid_registry );
        *registry = cff->registry;
      }

      if ( ordering )
      {
        if ( !cff->ordering )
          cff->ordering = cff_index_get_sid_string( cff,
                                                    dict->cid_ordering );
        *ordering = cff->ordering;
      }

      /*
       * XXX: According to Adobe TechNote #5176, the supplement in CFF
       *      can be a real number. We truncate it to fit public API
       *      since freetype-2.3.6.
       */
      if ( supplement )
      {
        if ( dict->cid_supplement < FT_INT_MIN ||
             dict->cid_supplement > FT_INT_MAX )
          FT_TRACE1(( "cff_get_ros: too large supplement %d is truncated\n",
                      dict->cid_supplement ));
        *supplement = (FT_Int)dict->cid_supplement;
      }
    }

  Fail:
    return error;
  }